

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::ThreadDNSAddressSeed(CConnman *this)

{
  CThreadInterrupt *this_00;
  long lVar1;
  DNSLookupFn dns_lookup_function;
  pointer pCVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  time_point tVar6;
  time_point tVar7;
  char *pcVar8;
  size_t sVar9;
  duration dVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  int source_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer cip;
  ulong uVar13;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  Level in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  pointer args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_stack_fffffffffffffe18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *args_00;
  pointer pbVar14;
  _Any_data local_1d8;
  code *local_1c8;
  vector<CNetAddr,_std::allocator<CNetAddr>_> addresses;
  ServiceFlags requiredServiceBits;
  vector<CAddress,_std::allocator<CAddress>_> vAdd;
  int found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seeds;
  direct_or_indirect local_160;
  uint local_150;
  undefined8 local_148;
  undefined2 local_140;
  direct_or_indirect local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined2 local_118;
  long local_110;
  undefined8 local_108;
  direct_or_indirect local_100;
  uint local_f0;
  string host;
  FastRandomContext rng;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rng.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&rng.rng;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rng,"-seednode","");
  bVar3 = ArgsManager::IsArgSet(&gArgs,(string *)&rng);
  if ((ChaCha20 *)rng.super_RandomMixin<FastRandomContext>.bitbuf != &rng.rng) {
    operator_delete((void *)rng.super_RandomMixin<FastRandomContext>.bitbuf,
                    rng.rng.m_aligned.input._0_8_ + 1);
  }
  iVar5 = 0;
  if (bVar3) {
    tVar6 = NodeClock::now();
    rng.super_RandomMixin<FastRandomContext>.bitbuf = 0x1e;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x50;
    logging_function._M_str = "ThreadDNSAddressSeed";
    logging_function._M_len = 0x14;
    LogPrintf_<long>(logging_function,source_file,0x88e,ALL,Info,
                     "-seednode enabled. Trying the provided seeds for %d seconds before defaulting to the dnsseeds.\n"
                     ,(long *)&rng);
    iVar5 = 0;
    do {
      bVar3 = CThreadInterrupt::operator_cast_to_bool(&this->interruptNet);
      if (bVar3) goto LAB_008c5a04;
      bVar3 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
      if (!bVar3) goto LAB_008c604d;
      tVar7 = NodeClock::now();
      if ((long)tVar6.__d.__r + 30000000000 < (long)tVar7.__d.__r) {
        pcVar8 = 
        "Couldn\'t connect to enough peers via seed nodes. Handing fetch logic to the DNS seeds.\n";
        source_line = 0x896;
        goto LAB_008c59f1;
      }
      iVar5 = GetFullOutboundConnCount(this);
    } while (iVar5 < 2);
    pcVar8 = "P2P peers available. Finished fetching data from seed nodes.\n";
    source_line = 0x89c;
LAB_008c59f1:
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x50;
    logging_function_00._M_str = "ThreadDNSAddressSeed";
    logging_function_00._M_len = 0x14;
    ::LogPrintf_<>(logging_function_00,source_file_00,source_line,ALL,Info,pcVar8);
  }
LAB_008c5a04:
  FastRandomContext::FastRandomContext(&rng,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&seeds,&this->m_params->vSeeds);
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,FastRandomContext&>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )seeds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )seeds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&rng);
  local_138.indirect_contents.indirect = (char *)&local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"-forcednsseed","");
  bVar3 = ArgsManager::GetBoolArg(&gArgs,(string *)&local_138.indirect_contents,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.indirect_contents.indirect != &local_128) {
    operator_delete(local_138.indirect_contents.indirect,
                    CONCAT44(local_128._M_allocated_capacity._4_4_,
                             local_128._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    uVar13 = 0;
    sVar9 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    if (sVar9 != 0) goto LAB_008c5ad7;
  }
  uVar13 = (ulong)((long)seeds.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)seeds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 5;
LAB_008c5ad7:
  if ((iVar5 < 2) || ((int)uVar13 != 0)) {
    found = 0;
    sVar9 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x12c;
    if (sVar9 < 1000) {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xb;
    }
    args = seeds.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (seeds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        seeds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = &this->interruptNet;
      pbVar14 = seeds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        args_00 = paVar11;
        if ((int)uVar13 == 0) {
          sVar9 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
          uVar13 = 3;
          args_00 = paVar11;
          if (sVar9 != 0) {
            source_file_04._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file_04._M_len = 0x50;
            logging_function_04._M_str = "ThreadDNSAddressSeed";
            logging_function_04._M_len = 0x14;
            local_138.indirect_contents.indirect = (char *)paVar11;
            LogPrintf_<long>(logging_function_04,source_file_04,0x8c7,ALL,Info,
                             "Waiting %d seconds before querying DNS seeds.\n",
                             (long *)local_138.direct);
            while (0 < (long)paVar11) {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0xb;
              if (paVar11 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0xb) {
                paVar12 = paVar11;
              }
              bVar3 = CThreadInterrupt::sleep_for(this_00,(duration)((long)paVar12 * 1000000000));
              if (!bVar3) goto LAB_008c6033;
              iVar5 = GetFullOutboundConnCount(this);
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar11->_M_local_buf + -(long)paVar12);
              if (1 < iVar5) {
                if (found < 1) {
                  pcVar8 = "P2P peers available. Skipped DNS seeding.\n";
                  iVar5 = 0x8d6;
                }
                else {
                  source_file_06._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ;
                  source_file_06._M_len = 0x50;
                  logging_function_06._M_str = "ThreadDNSAddressSeed";
                  logging_function_06._M_len = 0x14;
                  LogPrintf_<int>(logging_function_06,source_file_06,0x8d3,(LogFlags)&found,
                                  in_stack_fffffffffffffe08,(char *)args,
                                  (int *)args_00->_M_local_buf);
                  pcVar8 = "P2P peers available. Finished DNS seeding.\n";
                  iVar5 = 0x8d4;
                }
                source_file_07._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_07._M_len = 0x50;
                logging_function_07._M_str = "ThreadDNSAddressSeed";
                logging_function_07._M_len = 0x14;
                ::LogPrintf_<>(logging_function_07,source_file_07,iVar5,ALL,Info,pcVar8);
                goto LAB_008c6033;
              }
            }
          }
        }
        paVar11 = args_00;
        bVar3 = CThreadInterrupt::operator_cast_to_bool(this_00);
        if (bVar3) goto LAB_008c6033;
        if (((this->fNetworkActive)._M_base._M_i & 1U) == 0) {
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_02._M_len = 0x50;
          logging_function_02._M_str = "ThreadDNSAddressSeed";
          logging_function_02._M_len = 0x14;
          ::LogPrintf_<>(logging_function_02,source_file_02,0x8e2,ALL,Info,
                         "Waiting for network to be reactivated before querying DNS seeds.\n");
          do {
            bVar3 = CThreadInterrupt::sleep_for(this_00,(duration)0x3b9aca00);
            if (!bVar3) goto LAB_008c6033;
          } while (((this->fNetworkActive)._M_base._M_i & 1U) == 0);
        }
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8e8;
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_03._M_len = 0x50;
        logging_function_03._M_str = "ThreadDNSAddressSeed";
        logging_function_03._M_len = 0x14;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_03,source_file_03,0x8e8,ALL,Info,
                   "Loading addresses from DNS seed %s\n",args);
        bVar3 = HaveNameProxy();
        if (bVar3) {
          AddAddrFetch(this,args);
LAB_008c5f67:
          uVar13 = (ulong)((int)uVar13 - 1);
        }
        else {
          vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          requiredServiceBits = NODE_WITNESS|NODE_NETWORK;
          tinyformat::format<ServiceFlags,std::__cxx11::string>
                    (&host,(tinyformat *)"x%x.%s",(char *)&requiredServiceBits,(ServiceFlags *)args,
                     args_1);
          CNetAddr::CNetAddr((CNetAddr *)&local_100.indirect_contents);
          cVar4 = CNetAddr::SetInternal((CNetAddr *)&local_100.indirect_contents,&host);
          iVar5 = 5;
          if ((bool)cVar4) {
            std::
            function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
            ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                        *)&local_1d8,&g_dns_lookup_abi_cxx11_);
            dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffe0c;
            dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffe08;
            dns_lookup_function.super__Function_base._M_functor._8_8_ = args;
            dns_lookup_function.super__Function_base._M_manager = (_Manager_type)paVar11;
            dns_lookup_function._M_invoker = (_Invoker_type)pbVar14;
            LookupHost(&addresses,&host,0x20,true,dns_lookup_function);
            in_stack_fffffffffffffe0c = CONCAT13(cVar4,(int3)in_stack_fffffffffffffe0c);
            if (local_1c8 != (code *)0x0) {
              (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
            }
            pCVar2 = addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            cip = addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                  super__Vector_impl_data._M_start;
            if (addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                super__Vector_impl_data._M_start ==
                addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              AddAddrFetch(this,args);
            }
            else {
              do {
                CService::CService((CService *)&local_160.indirect_contents,cip,
                                   this->m_params->nDefaultPort);
                prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                           &local_138.indirect_contents,
                           (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                           &local_160.indirect_contents);
                local_128._8_8_ = local_148;
                local_118 = local_140;
                local_110 = 100000000;
                local_108 = 9;
                if (0x10 < local_150) {
                  free(local_160.indirect_contents.indirect);
                  local_160.indirect_contents.indirect = (char *)0x0;
                }
                tVar6 = NodeClock::now();
                dVar10 = RandomMixin<FastRandomContext>::
                         rand_uniform_duration<std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                   (&rng.super_RandomMixin<FastRandomContext>,
                                    (duration)0xfffffffffffaba00);
                local_110 = dVar10.__r + (long)tVar6.__d.__r / 1000000000 + -0x3f480;
                std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                          (&vAdd,(value_type *)&local_138.indirect_contents);
                found = found + 1;
                if (0x10 < (uint)local_128._M_allocated_capacity._0_4_) {
                  free(local_138.indirect_contents.indirect);
                }
                cip = cip + 1;
              } while (cip != pCVar2);
              AddrMan::Add(this->addrman,&vAdd,(CNetAddr *)&local_100.indirect_contents,(seconds)0x0
                          );
            }
            std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&addresses);
            iVar5 = 0;
            cVar4 = (char)((uint)in_stack_fffffffffffffe0c >> 0x18);
          }
          if (0x10 < local_f0) {
            free(local_100.indirect_contents.indirect);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)host._M_dataplus._M_p != &host.field_2) {
            operator_delete(host._M_dataplus._M_p,host.field_2._M_allocated_capacity + 1);
          }
          std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAdd);
          if (cVar4 != '\0') goto LAB_008c5f67;
          if ((iVar5 != 5) && (iVar5 != 0)) goto LAB_008c6033;
        }
        args = args + 1;
        in_stack_fffffffffffffe18 = paVar11;
      } while (args != pbVar14);
    }
    source_file_05._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file_05._M_len = 0x50;
    logging_function_05._M_str = "ThreadDNSAddressSeed";
    logging_function_05._M_len = 0x14;
    LogPrintf_<int>(logging_function_05,source_file_05,0x90c,(LogFlags)&found,
                    in_stack_fffffffffffffe08,(char *)args,
                    (int *)in_stack_fffffffffffffe18->_M_local_buf);
  }
  else {
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file_01._M_len = 0x50;
    logging_function_01._M_str = "ThreadDNSAddressSeed";
    logging_function_01._M_len = 0x14;
    ::LogPrintf_<>(logging_function_01,source_file_01,0x90e,ALL,Info,
                   "Skipping DNS seeds. Enough peers have been found\n");
  }
LAB_008c6033:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&seeds);
  ChaCha20::~ChaCha20(&rng.rng);
LAB_008c604d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadDNSAddressSeed()
{
    int outbound_connection_count = 0;

    if (gArgs.IsArgSet("-seednode")) {
        auto start = NodeClock::now();
        constexpr std::chrono::seconds SEEDNODE_TIMEOUT = 30s;
        LogPrintf("-seednode enabled. Trying the provided seeds for %d seconds before defaulting to the dnsseeds.\n", SEEDNODE_TIMEOUT.count());
        while (!interruptNet) {
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;

            // Abort if we have spent enough time without reaching our target.
            // Giving seed nodes 30 seconds so this does not become a race against fixedseeds (which triggers after 1 min)
            if (NodeClock::now() > start + SEEDNODE_TIMEOUT) {
                LogPrintf("Couldn't connect to enough peers via seed nodes. Handing fetch logic to the DNS seeds.\n");
                break;
            }

            outbound_connection_count = GetFullOutboundConnCount();
            if (outbound_connection_count >= SEED_OUTBOUND_CONNECTION_THRESHOLD) {
                LogPrintf("P2P peers available. Finished fetching data from seed nodes.\n");
                break;
            }
        }
    }

    FastRandomContext rng;
    std::vector<std::string> seeds = m_params.DNSSeeds();
    std::shuffle(seeds.begin(), seeds.end(), rng);
    int seeds_right_now = 0; // Number of seeds left before testing if we have enough connections

    if (gArgs.GetBoolArg("-forcednsseed", DEFAULT_FORCEDNSSEED)) {
        // When -forcednsseed is provided, query all.
        seeds_right_now = seeds.size();
    } else if (addrman.Size() == 0) {
        // If we have no known peers, query all.
        // This will occur on the first run, or if peers.dat has been
        // deleted.
        seeds_right_now = seeds.size();
    }

    // Proceed with dnsseeds if seednodes hasn't reached the target or if forcednsseed is set
    if (outbound_connection_count < SEED_OUTBOUND_CONNECTION_THRESHOLD || seeds_right_now) {
        // goal: only query DNS seed if address need is acute
        // * If we have a reasonable number of peers in addrman, spend
        //   some time trying them first. This improves user privacy by
        //   creating fewer identifying DNS requests, reduces trust by
        //   giving seeds less influence on the network topology, and
        //   reduces traffic to the seeds.
        // * When querying DNS seeds query a few at once, this ensures
        //   that we don't give DNS seeds the ability to eclipse nodes
        //   that query them.
        // * If we continue having problems, eventually query all the
        //   DNS seeds, and if that fails too, also try the fixed seeds.
        //   (done in ThreadOpenConnections)
        int found = 0;
        const std::chrono::seconds seeds_wait_time = (addrman.Size() >= DNSSEEDS_DELAY_PEER_THRESHOLD ? DNSSEEDS_DELAY_MANY_PEERS : DNSSEEDS_DELAY_FEW_PEERS);

        for (const std::string& seed : seeds) {
            if (seeds_right_now == 0) {
                seeds_right_now += DNSSEEDS_TO_QUERY_AT_ONCE;

                if (addrman.Size() > 0) {
                    LogPrintf("Waiting %d seconds before querying DNS seeds.\n", seeds_wait_time.count());
                    std::chrono::seconds to_wait = seeds_wait_time;
                    while (to_wait.count() > 0) {
                        // if sleeping for the MANY_PEERS interval, wake up
                        // early to see if we have enough peers and can stop
                        // this thread entirely freeing up its resources
                        std::chrono::seconds w = std::min(DNSSEEDS_DELAY_FEW_PEERS, to_wait);
                        if (!interruptNet.sleep_for(w)) return;
                        to_wait -= w;

                        if (GetFullOutboundConnCount() >= SEED_OUTBOUND_CONNECTION_THRESHOLD) {
                            if (found > 0) {
                                LogPrintf("%d addresses found from DNS seeds\n", found);
                                LogPrintf("P2P peers available. Finished DNS seeding.\n");
                            } else {
                                LogPrintf("P2P peers available. Skipped DNS seeding.\n");
                            }
                            return;
                        }
                    }
                }
            }

            if (interruptNet) return;

            // hold off on querying seeds if P2P network deactivated
            if (!fNetworkActive) {
                LogPrintf("Waiting for network to be reactivated before querying DNS seeds.\n");
                do {
                    if (!interruptNet.sleep_for(std::chrono::seconds{1})) return;
                } while (!fNetworkActive);
            }

            LogPrintf("Loading addresses from DNS seed %s\n", seed);
            // If -proxy is in use, we make an ADDR_FETCH connection to the DNS resolved peer address
            // for the base dns seed domain in chainparams
            if (HaveNameProxy()) {
                AddAddrFetch(seed);
            } else {
                std::vector<CAddress> vAdd;
                constexpr ServiceFlags requiredServiceBits{SeedsServiceFlags()};
                std::string host = strprintf("x%x.%s", requiredServiceBits, seed);
                CNetAddr resolveSource;
                if (!resolveSource.SetInternal(host)) {
                    continue;
                }
                // Limit number of IPs learned from a single DNS seed. This limit exists to prevent the results from
                // one DNS seed from dominating AddrMan. Note that the number of results from a UDP DNS query is
                // bounded to 33 already, but it is possible for it to use TCP where a larger number of results can be
                // returned.
                unsigned int nMaxIPs = 32;
                const auto addresses{LookupHost(host, nMaxIPs, true)};
                if (!addresses.empty()) {
                    for (const CNetAddr& ip : addresses) {
                        CAddress addr = CAddress(CService(ip, m_params.GetDefaultPort()), requiredServiceBits);
                        addr.nTime = rng.rand_uniform_delay(Now<NodeSeconds>() - 3 * 24h, -4 * 24h); // use a random age between 3 and 7 days old
                        vAdd.push_back(addr);
                        found++;
                    }
                    addrman.Add(vAdd, resolveSource);
                } else {
                    // If the seed does not support a subdomain with our desired service bits,
                    // we make an ADDR_FETCH connection to the DNS resolved peer address for the
                    // base dns seed domain in chainparams
                    AddAddrFetch(seed);
                }
            }
            --seeds_right_now;
        }
        LogPrintf("%d addresses found from DNS seeds\n", found);
    } else {
        LogPrintf("Skipping DNS seeds. Enough peers have been found\n");
    }
}